

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomWidget::~DomWidget(DomWidget *this)

{
  QList<DomProperty_*> *this_00;
  QList<DomProperty_*> *this_01;
  QList<DomRow_*> *this_02;
  QList<DomColumn_*> *this_03;
  QList<DomItem_*> *this_04;
  QList<DomLayout_*> *this_05;
  QList<DomWidget_*> *this_06;
  QList<DomAction_*> *this_07;
  QList<DomActionGroup_*> *this_08;
  QList<DomActionRef_*> *this_09;
  
  QList<QString>::clear(&this->m_class);
  this_00 = &this->m_property;
  qDeleteAll<QList<DomProperty*>>(this_00);
  QList<DomProperty_*>::clear(this_00);
  this_01 = &this->m_attribute;
  qDeleteAll<QList<DomProperty*>>(this_01);
  QList<DomProperty_*>::clear(this_01);
  this_02 = &this->m_row;
  qDeleteAll<QList<DomRow*>>(this_02);
  QList<DomRow_*>::clear(this_02);
  this_03 = &this->m_column;
  qDeleteAll<QList<DomColumn*>>(this_03);
  QList<DomColumn_*>::clear(this_03);
  this_04 = &this->m_item;
  qDeleteAll<QList<DomItem*>>(this_04);
  QList<DomItem_*>::clear(this_04);
  this_05 = &this->m_layout;
  qDeleteAll<QList<DomLayout*>>(this_05);
  QList<DomLayout_*>::clear(this_05);
  this_06 = &this->m_widget;
  qDeleteAll<QList<DomWidget*>>(this_06);
  QList<DomWidget_*>::clear(this_06);
  this_07 = &this->m_action;
  qDeleteAll<QList<DomAction*>>(this_07);
  QList<DomAction_*>::clear(this_07);
  this_08 = &this->m_actionGroup;
  qDeleteAll<QList<DomActionGroup*>>(this_08);
  QList<DomActionGroup_*>::clear(this_08);
  this_09 = &this->m_addAction;
  qDeleteAll<QList<DomActionRef*>>(this_09);
  QList<DomActionRef_*>::clear(this_09);
  QList<QString>::clear(&this->m_zOrder);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_zOrder).d);
  QArrayDataPointer<DomActionRef_*>::~QArrayDataPointer(&this_09->d);
  QArrayDataPointer<DomActionGroup_*>::~QArrayDataPointer(&this_08->d);
  QArrayDataPointer<DomAction_*>::~QArrayDataPointer(&this_07->d);
  QArrayDataPointer<DomWidget_*>::~QArrayDataPointer(&this_06->d);
  QArrayDataPointer<DomLayout_*>::~QArrayDataPointer(&this_05->d);
  QArrayDataPointer<DomItem_*>::~QArrayDataPointer(&this_04->d);
  QArrayDataPointer<DomColumn_*>::~QArrayDataPointer(&this_03->d);
  QArrayDataPointer<DomRow_*>::~QArrayDataPointer(&this_02->d);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&this_01->d);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer(&this_00->d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_class).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_attr_name).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

DomWidget::~DomWidget()
{
    m_class.clear();
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
    qDeleteAll(m_row);
    m_row.clear();
    qDeleteAll(m_column);
    m_column.clear();
    qDeleteAll(m_item);
    m_item.clear();
    qDeleteAll(m_layout);
    m_layout.clear();
    qDeleteAll(m_widget);
    m_widget.clear();
    qDeleteAll(m_action);
    m_action.clear();
    qDeleteAll(m_actionGroup);
    m_actionGroup.clear();
    qDeleteAll(m_addAction);
    m_addAction.clear();
    m_zOrder.clear();
}